

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::storeResultPixels
          (SRGBTestCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *resultPixelData)

{
  float *pfVar1;
  ostringstream *this_00;
  TextureFormat TVar2;
  TestLog *pTVar3;
  long lVar4;
  pointer pTVar5;
  long lVar6;
  long lVar7;
  ostringstream message;
  ConstPixelBufferAccess local_380;
  long *local_358;
  long local_350;
  long local_348 [2];
  Vec4 local_338;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  pTVar3 = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_380.m_data = pTVar3;
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  pTVar5 = (this->m_textureResultList).
           super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_textureResultList).
                              super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) >> 3) *
          -0x33333333) {
    lVar7 = 0;
    lVar6 = 0;
    lVar4 = 0;
    do {
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)local_328,
                 (TextureLevel *)((long)(pTVar5->m_size).m_data + lVar6 + -8));
      tcu::ConstPixelBufferAccess::getPixel
                (&local_380,(int)(string *)local_328,this->m_px,this->m_py);
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 resultPixelData,(Vector<float,_4> *)&local_380);
      local_328._0_8_ = local_318;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Result color: ","");
      pfVar1 = (float *)((long)((resultPixelData->
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7);
      local_338.m_data._0_8_ = *(undefined8 *)pfVar1;
      local_338.m_data._8_8_ = *(undefined8 *)(pfVar1 + 2);
      logColor(this,(string *)local_328,(int)lVar4,&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_,local_318[0]._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + 1;
      pTVar5 = (this->m_textureResultList).
               super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x28;
      lVar7 = lVar7 + 0x10;
    } while (lVar4 < (int)((ulong)((long)(this->m_textureResultList).
                                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5)
                          >> 3) * -0x33333333);
  }
  tcu::operator<<((ostream *)local_1a8,&this->m_epsilonError);
  this_00 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = local_380.m_data;
  std::__cxx11::ostringstream::ostringstream(this_00);
  TVar2 = (TextureFormat)(local_380.m_size.m_data + 2);
  local_380.m_format = TVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Epsilon error: ","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(char *)local_380.m_format,local_380.m_size.m_data._0_8_);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_358,local_350)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  if (local_380.m_format != TVar2) {
    operator_delete((void *)local_380.m_format,local_380._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void SRGBTestCase::storeResultPixels (std::vector<tcu::Vec4>& resultPixelData)
{
	tcu::TestLog&		log			= m_context.getTestContext().getLog();
	std::ostringstream	message;
	int					width		= m_context.getRenderContext().getRenderTarget().getWidth();
	int					height		= m_context.getRenderContext().getRenderTarget().getHeight();

	// ensure result sampling coordinates are within range of the result color attachment
	DE_ASSERT((m_px >= 0) && (m_px < width));
	DE_ASSERT((m_py >= 0) && (m_py < height));
	DE_UNREF(width && height);

	for (int idx = 0; idx < (int)m_textureResultList.size(); idx++)
	{
		resultPixelData.push_back(m_textureResultList[idx].getAccess().getPixel(m_px, m_py));
		this->logColor(std::string("Result color: "), idx, resultPixelData[idx]);
	}

	// log error rate (threshold)
	message << m_epsilonError;
	log << tcu::TestLog::Message << std::string("Epsilon error: ") << message.str() << tcu::TestLog::EndMessage;
}